

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiInputTextState::ClearFreeMemory(ImGuiInputTextState *this)

{
  ImGuiInputTextState *this_local;
  
  ImVector<unsigned_short>::clear(&this->TextW);
  ImVector<char>::clear(&this->TextA);
  ImVector<char>::clear(&this->InitialTextA);
  return;
}

Assistant:

void        ClearFreeMemory()           { TextW.clear(); TextA.clear(); InitialTextA.clear(); }